

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_dequant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  size_t sVar6;
  size_t sVar7;
  pointer pfVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  int *piVar21;
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  unkbyte10 Var27;
  float *pfVar28;
  uint uVar29;
  long lVar30;
  char *pcVar31;
  uint _h;
  int iVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  uint uVar42;
  uint _w;
  int iVar43;
  int iVar44;
  char *pcVar45;
  undefined1 *puVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  ulong *puVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  ulong uVar54;
  char *pcVar55;
  long lVar56;
  void *pvVar57;
  void *pvVar58;
  float *pfVar59;
  int iVar60;
  int iVar61;
  long lVar62;
  long lVar63;
  float *pfVar64;
  float *pfVar65;
  undefined1 *puVar66;
  int iVar67;
  short sVar68;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar69 [12];
  undefined1 auVar72 [16];
  undefined1 auVar70 [12];
  undefined1 auVar75 [16];
  undefined1 auVar71 [12];
  undefined1 auVar78 [16];
  short sVar84;
  float fVar85;
  undefined1 auVar86 [12];
  short sVar99;
  short sVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  short sVar98;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  short sVar101;
  short sVar103;
  undefined1 auVar102 [16];
  float fVar104;
  undefined1 auVar105 [16];
  short sVar106;
  short sVar108;
  undefined1 auVar107 [16];
  float fVar109;
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  short sVar115;
  short sVar118;
  short sVar119;
  short sVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar121 [16];
  int sum0 [4];
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  uint local_210;
  uint local_200;
  undefined1 local_1b8 [16];
  ulong local_1a0;
  undefined8 local_198;
  ulong local_190;
  ulong local_188;
  Mat *local_180;
  long local_178;
  void *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  long local_130;
  void *local_128;
  pointer local_120;
  undefined1 local_118 [64];
  size_t local_d8;
  undefined1 local_c8 [64];
  size_t local_88;
  undefined1 local_78 [64];
  size_t local_38;
  undefined1 auVar79 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  
  iVar43 = bottom_blob->w;
  uVar49 = bottom_blob->c;
  iVar48 = top_blob->w;
  iVar44 = top_blob->h;
  local_1a0 = (ulong)top_blob->c;
  _w = uVar49 * kernel_h * kernel_w;
  _h = iVar44 * iVar48;
  local_38 = 0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_8_ = 0;
  local_78._24_4_ = 0;
  local_78._32_8_ = (Allocator *)0x0;
  local_78._40_4_ = 0;
  local_78._44_4_ = 0;
  local_78._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_180 = top_blob;
  Mat::create((Mat *)local_78,_w,_h,1,opt->workspace_allocator);
  if (0 < iVar44) {
    iVar61 = 0;
    iVar47 = 0;
    iVar33 = 0;
    do {
      if (0 < iVar48) {
        iVar32 = 0;
        iVar67 = iVar61;
        do {
          if (0 < (int)uVar49) {
            uVar35 = 0;
            do {
              if (0 < kernel_h) {
                sVar6 = bottom_blob->cstep;
                sVar7 = bottom_blob->elemsize;
                pvVar57 = bottom_blob->data;
                iVar51 = 0;
                iVar60 = iVar67;
                do {
                  if (0 < kernel_w) {
                    uVar40 = 0;
                    do {
                      *(undefined1 *)(local_78._0_8_ + uVar40 + (long)iVar47) =
                           *(undefined1 *)
                            ((long)pvVar57 + (long)(iVar60 + (int)uVar40) + sVar6 * uVar35 * sVar7);
                      uVar40 = uVar40 + 1;
                    } while ((uint)kernel_w != uVar40);
                    iVar47 = iVar47 + (int)uVar40;
                  }
                  iVar51 = iVar51 + 1;
                  iVar60 = iVar60 + iVar43;
                } while (iVar51 != kernel_h);
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar49);
          }
          iVar32 = iVar32 + 1;
          iVar67 = iVar67 + stride_w;
        } while (iVar32 != iVar48);
      }
      iVar33 = iVar33 + 1;
      iVar61 = iVar61 + stride_h * iVar43;
    } while (iVar33 != iVar44);
  }
  iVar43 = kernel_h * kernel_w * 4;
  uVar29 = _h + 3;
  if (-1 < (int)_h) {
    uVar29 = _h;
  }
  local_d8 = 0;
  local_118._0_8_ = (void *)0x0;
  local_118._8_4_ = 0;
  local_118._12_4_ = 0;
  local_118._16_8_ = 0;
  local_118._24_4_ = 0;
  local_118._32_8_ = (Allocator *)0x0;
  local_118._40_4_ = 0;
  local_118._44_4_ = 0;
  local_118._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_118,iVar43,uVar49,_h + ((int)uVar29 >> 2) * -3,1,opt->workspace_allocator
             );
  local_190 = local_1a0;
  local_198 = CONCAT44(local_198._4_4_,_h) & 0xfffffffffffffffc;
  if (0 < (int)_h >> 2) {
    local_188 = (ulong)(uint)((int)_h >> 2);
    lVar56 = 1;
    lVar41 = 3;
    lVar52 = 2;
    lVar38 = 0;
    uVar35 = 0;
    do {
      lVar53 = (long)(int)local_78._44_4_;
      puVar66 = (undefined1 *)(local_d8 * uVar35 * local_118._16_8_ + local_118._0_8_);
      if ((int)_w < 2) {
        lVar53 = local_78._16_8_ * lVar53;
        lVar62 = uVar35 * 4 * lVar53;
        lVar63 = (uVar35 * 4 + 1) * lVar53;
        lVar37 = (uVar35 * 4 + 2) * lVar53;
        lVar30 = (uVar35 * 4 + 3) * lVar53;
        uVar29 = 0;
      }
      else {
        lVar62 = local_78._16_8_ * lVar38 * lVar53;
        lVar63 = local_78._16_8_ * lVar56 * lVar53;
        lVar30 = local_78._16_8_ * lVar41 * lVar53;
        lVar53 = local_78._16_8_ * lVar52 * lVar53;
        lVar36 = 0;
        do {
          puVar46 = puVar66;
          puVar66 = (undefined1 *)
                    (local_118._0_8_ + lVar36 * 4 + local_d8 * local_118._16_8_ * uVar35);
          *puVar66 = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar62);
          puVar66[1] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar62 + 1);
          puVar66[2] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar63);
          puVar66[3] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar63 + 1);
          puVar66[4] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar53);
          puVar66[5] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar53 + 1);
          puVar66[6] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar30);
          puVar66[7] = *(undefined1 *)(local_78._0_8_ + lVar36 + lVar30 + 1);
          lVar37 = lVar36 + 2;
          iVar48 = (int)lVar36;
          lVar36 = lVar37;
          puVar66 = puVar66 + 8;
        } while (iVar48 + 3 < (int)_w);
        puVar66 = puVar46 + 8;
        lVar62 = lVar62 + lVar37;
        lVar63 = lVar63 + lVar37;
        lVar30 = lVar30 + lVar37;
        lVar37 = lVar53 + lVar37;
        uVar29 = _w & 0xfffffffe;
      }
      if ((int)uVar29 < (int)_w) {
        lVar53 = 0;
        do {
          puVar66[lVar53 * 4] = *(undefined1 *)(local_78._0_8_ + lVar53 + lVar62);
          puVar66[lVar53 * 4 + 1] = *(undefined1 *)(local_78._0_8_ + lVar53 + lVar63);
          puVar66[lVar53 * 4 + 2] = *(undefined1 *)(local_78._0_8_ + lVar53 + lVar37);
          puVar66[lVar53 * 4 + 3] = *(undefined1 *)(local_78._0_8_ + lVar53 + lVar30);
          lVar53 = lVar53 + 1;
        } while (_w - uVar29 != (int)lVar53);
      }
      uVar35 = uVar35 + 1;
      lVar38 = lVar38 + 4;
      lVar56 = lVar56 + 4;
      lVar41 = lVar41 + 4;
      lVar52 = lVar52 + 4;
    } while (uVar35 != local_188);
  }
  if ((_h & 0xfffffffc) != _h) {
    lVar38 = (long)(int)(_h & 0xfffffffc);
    do {
      puVar66 = (undefined1 *)((int)local_78._44_4_ * lVar38 * local_78._16_8_ + local_78._0_8_);
      uVar29 = (uint)lVar38;
      uVar42 = uVar29 + 3;
      if (-1 < (int)uVar29) {
        uVar42 = uVar29;
      }
      puVar46 = (undefined1 *)
                ((long)(int)(((int)uVar42 >> 2) + (uVar29 - (uVar42 & 0xfffffffc))) * local_d8 *
                 local_118._16_8_ + local_118._0_8_);
      if ((int)_w < 2) {
        uVar29 = 0;
      }
      else {
        iVar48 = 1;
        do {
          *puVar46 = *puVar66;
          puVar46[1] = puVar66[1];
          puVar46 = puVar46 + 2;
          puVar66 = puVar66 + 2;
          iVar48 = iVar48 + 2;
          uVar29 = _w & 0xfffffffe;
        } while (iVar48 < (int)_w);
      }
      if ((int)uVar29 < (int)_w) {
        lVar41 = 0;
        do {
          puVar46[lVar41] = puVar66[lVar41];
          lVar41 = lVar41 + 1;
        } while (_w - uVar29 != (int)lVar41);
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 < (int)_h);
  }
  uVar29 = (uint)local_1a0;
  uVar42 = uVar29 + 3;
  if (-1 < (int)uVar29) {
    uVar42 = uVar29;
  }
  uVar34 = uVar29 + 3;
  if (-1 < (int)uVar29) {
    uVar34 = uVar29;
  }
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_c8,iVar43,uVar49,(uVar29 - (uVar34 & 0xfffffffc)) + ((int)uVar42 >> 2),1,
              opt->workspace_allocator);
  uVar29 = (int)uVar29 >> 2;
  local_190 = local_190 & 0xfffffffffffffffc;
  local_198 = (ulong)uVar29;
  if (0 < (int)uVar29) {
    local_210 = _w & 0xfffffffe;
    iVar44 = uVar49 * kernel_h * kernel_w;
    iVar48 = iVar44 * 3;
    iVar43 = iVar44 * 4;
    iVar44 = iVar44 * 2;
    iVar33 = 0;
    uVar35 = 0;
    uVar49 = _w;
    do {
      pvVar57 = (void *)(local_88 * uVar35 * local_c8._16_8_ + local_c8._0_8_);
      if ((int)_w < 2) {
        iVar61 = (int)uVar35;
        lVar38 = (long)&_kernel->data + (long)(int)((iVar61 * 4 + 3) * _w);
        lVar52 = (long)&_kernel->data + (long)(int)((iVar61 * 4 + 2) * _w);
        lVar56 = (long)&_kernel->data + (long)(int)((iVar61 * 4 + 1) * _w);
        lVar41 = (long)&_kernel->data + (long)(int)(iVar61 * 4 * _w);
        uVar42 = 0;
      }
      else {
        lVar38 = 0;
        do {
          pvVar58 = pvVar57;
          pvVar57 = (void *)(local_c8._0_8_ + lVar38 * 4 + 8 + local_88 * local_c8._16_8_ * uVar35);
          *(undefined1 *)((long)pvVar57 + -8) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + iVar33);
          *(undefined1 *)((long)pvVar57 + -7) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + (long)iVar33 + 1);
          *(undefined1 *)((long)pvVar57 + -6) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + (int)uVar49);
          *(undefined1 *)((long)pvVar57 + -5) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + (long)(int)uVar49 + 1);
          *(undefined1 *)((long)pvVar57 + -4) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + iVar44);
          *(undefined1 *)((long)pvVar57 + -3) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + (long)iVar44 + 1);
          *(undefined1 *)((long)pvVar57 + -2) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + iVar48);
          *(undefined1 *)((long)pvVar57 + -1) =
               *(undefined1 *)((long)&_kernel->data + lVar38 + (long)iVar48 + 1);
          lVar41 = lVar38 + 2;
          iVar61 = (int)lVar38;
          lVar38 = lVar41;
        } while (iVar61 + 3 < (int)_w);
        pvVar57 = (void *)((long)pvVar58 + 8);
        lVar38 = (long)&_kernel->data + lVar41 + iVar48;
        lVar52 = (long)&_kernel->data + lVar41 + iVar44;
        lVar56 = (long)&_kernel->data + lVar41 + (int)uVar49;
        lVar41 = (long)&_kernel->data + lVar41 + iVar33;
        uVar42 = local_210;
      }
      if ((int)uVar42 < (int)_w) {
        lVar53 = 0;
        do {
          *(undefined1 *)((long)pvVar57 + lVar53 * 4) = *(undefined1 *)(lVar41 + lVar53);
          *(undefined1 *)((long)pvVar57 + lVar53 * 4 + 1) = *(undefined1 *)(lVar56 + lVar53);
          *(undefined1 *)((long)pvVar57 + lVar53 * 4 + 2) = *(undefined1 *)(lVar52 + lVar53);
          *(undefined1 *)((long)pvVar57 + lVar53 * 4 + 3) = *(undefined1 *)(lVar38 + lVar53);
          lVar53 = lVar53 + 1;
        } while (_w - uVar42 != (int)lVar53);
      }
      uVar35 = uVar35 + 1;
      iVar48 = iVar48 + iVar43;
      iVar44 = iVar44 + iVar43;
      uVar49 = uVar49 + iVar43;
      iVar33 = iVar33 + iVar43;
    } while (uVar35 != local_198);
  }
  if ((int)local_190 != (int)local_1a0) {
    uVar35 = local_190;
    do {
      uVar49 = (uint)uVar35;
      uVar42 = uVar49 + 3;
      if (-1 < (int)uVar49) {
        uVar42 = uVar49;
      }
      puVar66 = (undefined1 *)
                ((long)(int)(((int)uVar42 >> 2) + (uVar49 - (uVar42 & 0xfffffffc))) * local_88 *
                 local_c8._16_8_ + local_c8._0_8_);
      puVar46 = (undefined1 *)((long)&_kernel->data + (long)(int)(_w * uVar49));
      if ((int)_w < 2) {
        uVar49 = 0;
      }
      else {
        iVar43 = 1;
        do {
          *puVar66 = *puVar46;
          puVar66[1] = puVar46[1];
          puVar66 = puVar66 + 2;
          puVar46 = puVar46 + 2;
          iVar43 = iVar43 + 2;
          uVar49 = _w & 0xfffffffe;
        } while (iVar43 < (int)_w);
      }
      if ((int)uVar49 < (int)_w) {
        lVar38 = 0;
        do {
          puVar66[lVar38] = puVar46[lVar38];
          lVar38 = lVar38 + 1;
        } while (_w - uVar49 != (int)lVar38);
      }
      uVar35 = uVar35 + 1;
    } while ((long)uVar35 < (long)local_1a0);
  }
  if (0 < (int)uVar29) {
    local_120 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
    local_128 = local_180->data;
    local_130 = local_180->cstep * local_180->elemsize;
    local_170 = (void *)local_c8._0_8_;
    local_178 = local_88 * local_c8._16_8_;
    local_200 = _w & 0xfffffffe;
    uVar35 = 0;
    do {
      uVar40 = uVar35 * 4;
      if (_bias == (Mat *)0x0) {
        fVar104 = 0.0;
        fVar85 = 0.0;
        fVar109 = 0.0;
        fVar110 = 0.0;
      }
      else {
        fVar85 = *(float *)(&_bias->data + uVar35 * 2);
        fVar109 = *(float *)((long)&_bias->data + uVar35 * 0x10 + 4);
        fVar104 = *(float *)(&_bias->refcount + uVar35 * 2);
        fVar110 = *(float *)((long)&_bias->refcount + uVar35 * 0x10 + 4);
      }
      pfVar59 = (float *)(local_130 * uVar40 + (long)local_128);
      pfVar28 = (float *)(local_130 * (uVar40 | 1) + (long)local_128);
      pfVar64 = (float *)(local_130 * (uVar40 | 2) + (long)local_128);
      pfVar65 = (float *)(local_130 * (uVar40 | 3) + (long)local_128);
      uVar39 = 0;
      fVar1 = local_120[uVar35 * 4];
      fVar2 = local_120[uVar40 | 1];
      fVar3 = local_120[uVar40 | 2];
      fVar4 = local_120[uVar40 | 3];
      if (3 < (int)_h) {
        pcVar45 = (char *)(local_178 * uVar35 + local_c8._0_8_);
        local_188 = CONCAT44(local_188._4_4_,fVar2);
        uVar40 = 0;
        do {
          puVar50 = (ulong *)((uVar40 >> 2) * local_d8 * local_118._16_8_ + local_118._0_8_);
          uVar49 = 0;
          local_1b8 = (undefined1  [16])0x0;
          local_148 = (undefined1  [16])0x0;
          local_158 = (undefined1  [16])0x0;
          local_168 = (undefined1  [16])0x0;
          pcVar31 = pcVar45;
          if (1 < (int)_w) {
            local_1b8._0_4_ = 0;
            local_1b8._4_4_ = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = 0;
            local_148._0_4_ = 0;
            local_148._4_4_ = 0;
            local_148._8_4_ = 0;
            local_148._12_4_ = 0;
            local_158._0_4_ = 0;
            local_158._4_4_ = 0;
            local_158._8_4_ = 0;
            local_158._12_4_ = 0;
            iVar43 = 1;
            local_168._0_4_ = 0;
            local_168._4_4_ = 0;
            local_168._8_4_ = 0;
            local_168._12_4_ = 0;
            do {
              iVar48 = (int)pcVar31[1];
              iVar44 = (int)*pcVar31;
              auVar88._4_4_ = iVar44;
              auVar88._0_4_ = iVar44;
              auVar88._8_4_ = iVar44;
              auVar88._12_4_ = iVar44;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = *puVar50;
              auVar116 = psllw(auVar87,8);
              auVar116 = psraw(auVar116,8);
              auVar121 = pshuflw(in_XMM15,ZEXT416((uint)(int)pcVar31[2]),0);
              sVar115 = auVar116._0_2_;
              in_XMM15._0_2_ = auVar121._0_2_ * sVar115;
              sVar118 = auVar116._2_2_;
              in_XMM15._2_2_ = auVar121._2_2_ * sVar118;
              sVar119 = auVar116._4_2_;
              in_XMM15._4_2_ = auVar121._4_2_ * sVar119;
              sVar120 = auVar116._6_2_;
              in_XMM15._6_2_ = auVar121._6_2_ * sVar120;
              in_XMM15._8_2_ = auVar121._8_2_ * auVar116._8_2_;
              in_XMM15._10_2_ = auVar121._10_2_ * auVar116._10_2_;
              in_XMM15._12_2_ = auVar121._12_2_ * auVar116._12_2_;
              in_XMM15._14_2_ = auVar121._14_2_ * auVar116._14_2_;
              auVar102 = pshuflw(ZEXT416((uint)(int)pcVar31[4]),ZEXT416((uint)(int)pcVar31[4]),0);
              sVar101 = auVar102._0_2_ * sVar115;
              sVar103 = auVar102._2_2_ * sVar118;
              auVar105 = pshuflw(ZEXT416((uint)(int)pcVar31[6]),ZEXT416((uint)(int)pcVar31[6]),0);
              auVar9._10_2_ = 0;
              auVar9._0_10_ = auVar116._0_10_;
              auVar9._12_2_ = sVar120;
              auVar13._8_2_ = sVar119;
              auVar13._0_8_ = auVar116._0_8_;
              auVar13._10_4_ = auVar9._10_4_;
              auVar22._6_8_ = 0;
              auVar22._0_6_ = auVar13._8_6_;
              auVar17._4_2_ = sVar118;
              auVar17._0_4_ = auVar116._0_4_;
              auVar17._6_8_ = SUB148(auVar22 << 0x40,6);
              auVar117._0_4_ = auVar116._0_4_ & 0xffff;
              auVar117._4_10_ = auVar17._4_10_;
              auVar117._14_2_ = 0;
              auVar121 = pmaddwd(auVar117,auVar88);
              auVar88 = psraw(auVar87,8);
              auVar116 = pshuflw(ZEXT416((uint)(int)pcVar31[3]),ZEXT416((uint)(int)pcVar31[3]),0);
              sVar84 = auVar88._0_2_;
              sVar68 = auVar116._0_2_ * sVar84;
              sVar98 = auVar88._2_2_;
              sVar81 = auVar116._2_2_ * sVar98;
              sVar99 = auVar88._4_2_;
              sVar82 = auVar116._4_2_ * sVar99;
              sVar100 = auVar88._6_2_;
              sVar83 = auVar116._6_2_ * sVar100;
              auVar107 = pshuflw(ZEXT416((uint)(int)pcVar31[5]),ZEXT416((uint)(int)pcVar31[5]),0);
              sVar106 = auVar107._0_2_ * sVar84;
              sVar108 = auVar107._2_2_ * sVar98;
              auVar87 = pshuflw(ZEXT416((uint)(int)pcVar31[7]),ZEXT416((uint)(int)pcVar31[7]),0);
              auVar10._10_2_ = 0;
              auVar10._0_10_ = auVar88._0_10_;
              auVar10._12_2_ = sVar100;
              auVar14._8_2_ = sVar99;
              auVar14._0_8_ = auVar88._0_8_;
              auVar14._10_4_ = auVar10._10_4_;
              auVar23._6_8_ = 0;
              auVar23._0_6_ = auVar14._8_6_;
              auVar18._4_2_ = sVar98;
              auVar18._0_4_ = auVar88._0_4_;
              auVar18._6_8_ = SUB148(auVar23 << 0x40,6);
              auVar89._0_4_ = auVar88._0_4_ & 0xffff;
              auVar89._4_10_ = auVar18._4_10_;
              auVar89._14_2_ = 0;
              auVar116._4_4_ = iVar48;
              auVar116._0_4_ = iVar48;
              auVar116._8_4_ = iVar48;
              auVar116._12_4_ = iVar48;
              auVar116 = pmaddwd(auVar89,auVar116);
              auVar90._0_4_ = auVar116._0_4_;
              local_1b8._0_4_ = local_1b8._0_4_ + auVar90._0_4_ + auVar121._0_4_;
              local_1b8._4_4_ = local_1b8._4_4_ + auVar116._4_4_ + auVar121._4_4_;
              local_1b8._8_4_ = local_1b8._8_4_ + auVar116._8_4_ + auVar121._8_4_;
              local_1b8._12_4_ = local_1b8._12_4_ + auVar116._12_4_ + auVar121._12_4_;
              Var27 = CONCAT64(CONCAT42(CONCAT22(sVar83,sVar83),sVar82),CONCAT22(sVar82,sVar83));
              auVar24._4_8_ = (long)((unkuint10)Var27 >> 0x10);
              auVar24._2_2_ = sVar81;
              auVar24._0_2_ = sVar81;
              auVar121._0_4_ = (int)sVar68;
              iVar48 = auVar24._0_4_ >> 0x10;
              auVar69._0_8_ = CONCAT44(iVar48,auVar121._0_4_);
              auVar69._8_4_ = (int)((unkuint10)Var27 >> 0x10) >> 0x10;
              auVar74._12_2_ = sVar81 >> 0xf;
              auVar74._0_12_ = auVar69;
              auVar74._14_2_ = in_XMM15._6_2_;
              auVar73._12_4_ = auVar74._12_4_;
              auVar73._0_10_ = auVar69._0_10_;
              auVar73._10_2_ = in_XMM15._4_2_;
              auVar72._10_6_ = auVar73._10_6_;
              auVar72._8_2_ = sVar81;
              auVar72._0_8_ = auVar69._0_8_;
              auVar121._8_8_ = auVar72._8_8_;
              auVar121._6_2_ = in_XMM15._2_2_;
              auVar121._4_2_ = sVar68 >> 0xf;
              auVar75._0_4_ = (int)in_XMM15._0_2_;
              iVar44 = auVar121._4_4_ >> 0x10;
              auVar70._0_8_ = CONCAT44(iVar44,auVar75._0_4_);
              auVar70._8_4_ = auVar72._8_4_ >> 0x10;
              local_148._0_4_ = local_148._0_4_ + auVar121._0_4_ + auVar75._0_4_;
              local_148._4_4_ = local_148._4_4_ + iVar48 + iVar44;
              local_148._8_4_ = local_148._8_4_ + auVar69._8_4_ + auVar70._8_4_;
              local_148._12_4_ = local_148._12_4_ + (int)sVar83 + (auVar73._12_4_ >> 0x10);
              auVar77._12_2_ = in_XMM15._2_2_ >> 0xf;
              auVar77._0_12_ = auVar70;
              auVar77._14_2_ = auVar102._6_2_ * sVar120;
              auVar76._12_4_ = auVar77._12_4_;
              auVar76._0_10_ = auVar70._0_10_;
              auVar76._10_2_ = auVar102._4_2_ * sVar119;
              auVar102._10_6_ = auVar76._10_6_;
              auVar102._8_2_ = in_XMM15._2_2_;
              auVar102._0_8_ = auVar70._0_8_;
              auVar75._8_8_ = auVar102._8_8_;
              auVar75._6_2_ = sVar103;
              auVar75._4_2_ = in_XMM15._0_2_ >> 0xf;
              auVar78._0_4_ = (int)sVar101;
              iVar48 = auVar75._4_4_ >> 0x10;
              auVar71._0_8_ = CONCAT44(iVar48,auVar78._0_4_);
              auVar71._8_4_ = auVar102._8_4_ >> 0x10;
              auVar93._0_12_ = auVar116._0_12_;
              auVar93._12_2_ = auVar116._6_2_;
              auVar93._14_2_ = auVar107._6_2_ * sVar100;
              auVar92._12_4_ = auVar93._12_4_;
              auVar92._0_10_ = auVar116._0_10_;
              auVar92._10_2_ = auVar107._4_2_ * sVar99;
              auVar91._10_6_ = auVar92._10_6_;
              auVar91._0_8_ = auVar116._0_8_;
              auVar91._8_2_ = auVar116._4_2_;
              auVar90._8_8_ = auVar91._8_8_;
              auVar90._6_2_ = sVar108;
              auVar90._4_2_ = auVar116._2_2_;
              auVar94._0_4_ = (int)sVar106;
              iVar44 = auVar90._4_4_ >> 0x10;
              auVar86._0_8_ = CONCAT44(iVar44,auVar94._0_4_);
              auVar86._8_4_ = auVar91._8_4_ >> 0x10;
              local_158._0_4_ = local_158._0_4_ + auVar94._0_4_ + auVar78._0_4_;
              local_158._4_4_ = local_158._4_4_ + iVar44 + iVar48;
              local_158._8_4_ = local_158._8_4_ + auVar86._8_4_ + auVar71._8_4_;
              local_158._12_4_ =
                   local_158._12_4_ + (auVar92._12_4_ >> 0x10) + (auVar76._12_4_ >> 0x10);
              auVar107._12_2_ = sVar103 >> 0xf;
              auVar107._0_12_ = auVar71;
              auVar107._14_2_ = auVar105._6_2_ * sVar120;
              auVar80._12_4_ = auVar107._12_4_;
              auVar80._0_10_ = auVar71._0_10_;
              auVar80._10_2_ = auVar105._4_2_ * sVar119;
              auVar79._10_6_ = auVar80._10_6_;
              auVar79._8_2_ = sVar103;
              auVar79._0_8_ = auVar71._0_8_;
              auVar78._8_8_ = auVar79._8_8_;
              auVar78._6_2_ = auVar105._2_2_ * sVar118;
              auVar78._4_2_ = sVar101 >> 0xf;
              auVar97._12_2_ = sVar108 >> 0xf;
              auVar97._0_12_ = auVar86;
              auVar97._14_2_ = auVar87._6_2_ * sVar100;
              auVar96._12_4_ = auVar97._12_4_;
              auVar96._0_10_ = auVar86._0_10_;
              auVar96._10_2_ = auVar87._4_2_ * sVar99;
              auVar95._10_6_ = auVar96._10_6_;
              auVar95._8_2_ = sVar108;
              auVar95._0_8_ = auVar86._0_8_;
              auVar94._8_8_ = auVar95._8_8_;
              auVar94._6_2_ = auVar87._2_2_ * sVar98;
              auVar94._4_2_ = sVar106 >> 0xf;
              local_168._0_4_ =
                   local_168._0_4_ + (int)(short)(auVar87._0_2_ * sVar84) +
                   (int)(short)(auVar105._0_2_ * sVar115);
              local_168._4_4_ = local_168._4_4_ + (auVar94._4_4_ >> 0x10) + (auVar78._4_4_ >> 0x10);
              local_168._8_4_ = local_168._8_4_ + (auVar95._8_4_ >> 0x10) + (auVar79._8_4_ >> 0x10);
              local_168._12_4_ =
                   local_168._12_4_ + (auVar96._12_4_ >> 0x10) + (auVar80._12_4_ >> 0x10);
              pcVar31 = pcVar31 + 8;
              puVar50 = puVar50 + 1;
              iVar43 = iVar43 + 2;
            } while (iVar43 < (int)_w);
            uVar49 = local_200;
          }
          if ((int)uVar49 < (int)_w) {
            do {
              cVar5 = *pcVar31;
              lVar38 = 0;
              do {
                iVar43 = (int)*(char *)((long)puVar50 + lVar38);
                *(int *)(local_1b8 + lVar38 * 4) = *(int *)(local_1b8 + lVar38 * 4) + iVar43 * cVar5
                ;
                *(int *)(local_148 + lVar38 * 4) =
                     *(int *)(local_148 + lVar38 * 4) + pcVar31[1] * iVar43;
                *(int *)(local_158 + lVar38 * 4) =
                     *(int *)(local_158 + lVar38 * 4) + pcVar31[2] * iVar43;
                *(int *)(local_168 + lVar38 * 4) =
                     *(int *)(local_168 + lVar38 * 4) + pcVar31[3] * iVar43;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 4);
              pcVar31 = pcVar31 + 4;
              puVar50 = (ulong *)((long)puVar50 + 4);
              uVar49 = uVar49 + 1;
            } while (uVar49 != _w);
          }
          lVar38 = 0;
          do {
            *(float *)((long)pfVar59 + lVar38) =
                 (float)*(int *)(local_1b8 + lVar38) * fVar1 + fVar85;
            *(float *)((long)pfVar28 + lVar38) =
                 (float)*(int *)(local_148 + lVar38) * fVar2 + fVar109;
            *(float *)((long)pfVar64 + lVar38) =
                 (float)*(int *)(local_158 + lVar38) * fVar3 + fVar104;
            *(float *)((long)pfVar65 + lVar38) =
                 (float)*(int *)(local_168 + lVar38) * fVar4 + fVar110;
            lVar38 = lVar38 + 4;
          } while (lVar38 != 0x10);
          pfVar59 = pfVar59 + 4;
          pfVar28 = pfVar28 + 4;
          pfVar64 = pfVar64 + 4;
          pfVar65 = pfVar65 + 4;
          uVar39 = uVar40 + 4;
          uVar54 = uVar40 + 7;
          uVar40 = uVar39;
        } while (uVar54 < _h);
      }
      if ((int)uVar39 < (int)_h) {
        pcVar45 = (char *)(local_178 * uVar35 + local_c8._0_8_);
        do {
          pcVar55 = (char *)((ulong)(((uint)uVar39 & 3) + ((uint)(uVar39 >> 2) & 0x3fffffff)) *
                             local_d8 * local_118._16_8_ + local_118._0_8_);
          iVar43 = 0;
          pcVar31 = pcVar45;
          if ((int)_w < 2) {
            iVar44 = 0;
            iVar33 = 0;
            iVar48 = 0;
            uVar49 = 0;
          }
          else {
            iVar48 = 0;
            iVar61 = 1;
            iVar33 = 0;
            iVar44 = 0;
            iVar43 = 0;
            do {
              iVar67 = (int)*pcVar55;
              iVar47 = (int)pcVar55[1];
              iVar43 = pcVar31[1] * iVar47 + *pcVar31 * iVar67 + iVar43;
              iVar44 = pcVar31[3] * iVar47 + pcVar31[2] * iVar67 + iVar44;
              iVar33 = pcVar31[5] * iVar47 + pcVar31[4] * iVar67 + iVar33;
              iVar48 = pcVar31[7] * iVar47 + pcVar31[6] * iVar67 + iVar48;
              pcVar31 = pcVar31 + 8;
              pcVar55 = pcVar55 + 2;
              iVar61 = iVar61 + 2;
              uVar49 = local_200;
            } while (iVar61 < (int)_w);
          }
          if ((int)uVar49 < (int)_w) {
            lVar38 = 0;
            do {
              iVar61 = (int)pcVar55[lVar38];
              iVar43 = iVar43 + pcVar31[lVar38 * 4] * iVar61;
              iVar44 = iVar44 + pcVar31[lVar38 * 4 + 1] * iVar61;
              iVar33 = iVar33 + pcVar31[lVar38 * 4 + 2] * iVar61;
              iVar48 = iVar48 + pcVar31[lVar38 * 4 + 3] * iVar61;
              lVar38 = lVar38 + 1;
            } while (_w - uVar49 != (int)lVar38);
          }
          *pfVar59 = (float)iVar43 * fVar1 + fVar85;
          *pfVar28 = (float)iVar44 * fVar2 + fVar109;
          *pfVar64 = (float)iVar33 * fVar3 + fVar104;
          *pfVar65 = (float)iVar48 * fVar4 + fVar110;
          pfVar59 = pfVar59 + 1;
          pfVar28 = pfVar28 + 1;
          pfVar64 = pfVar64 + 1;
          pfVar65 = pfVar65 + 1;
          uVar49 = (uint)uVar39 + 1;
          uVar39 = (ulong)uVar49;
        } while (uVar49 != _h);
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 != local_198);
  }
  if ((int)local_190 != (int)local_1a0) {
    pvVar57 = local_180->data;
    sVar6 = local_180->cstep;
    sVar7 = local_180->elemsize;
    pfVar8 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar38 = (long)(int)local_190;
    do {
      if (_bias == (Mat *)0x0) {
        fVar85 = 0.0;
      }
      else {
        fVar85 = *(float *)((long)&_bias->data + lVar38 * 4);
      }
      pfVar28 = (float *)(sVar6 * sVar7 * lVar38 + (long)pvVar57);
      uVar35 = 0;
      fVar109 = pfVar8[lVar38];
      uVar49 = (uint)lVar38;
      if (3 < (int)_h) {
        uVar29 = uVar49 + 3;
        if (-1 < (int)uVar49) {
          uVar29 = uVar49;
        }
        pcVar45 = (char *)((long)(int)(((int)uVar29 >> 2) + (uVar49 - (uVar29 & 0xfffffffc))) *
                           local_88 * local_c8._16_8_ + local_c8._0_8_);
        uVar40 = 0;
        do {
          puVar50 = (ulong *)((uVar40 >> 2) * local_d8 * local_118._16_8_ + local_118._0_8_);
          uVar29 = 0;
          local_1b8 = (undefined1  [16])0x0;
          pcVar31 = pcVar45;
          if (1 < (int)_w) {
            iVar43 = 1;
            local_1b8._0_4_ = 0;
            local_1b8._4_4_ = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = 0;
            do {
              iVar48 = (int)pcVar31[1];
              iVar44 = (int)*pcVar31;
              auVar105._4_4_ = iVar44;
              auVar105._0_4_ = iVar44;
              auVar105._8_4_ = iVar44;
              auVar105._12_4_ = iVar44;
              auVar111._4_4_ = iVar48;
              auVar111._0_4_ = iVar48;
              auVar111._8_4_ = iVar48;
              auVar111._12_4_ = iVar48;
              auVar112._8_8_ = 0;
              auVar112._0_8_ = *puVar50;
              auVar116 = psllw(auVar112,8);
              auVar116 = psraw(auVar116,8);
              auVar11._10_2_ = 0;
              auVar11._0_10_ = auVar116._0_10_;
              auVar11._12_2_ = auVar116._6_2_;
              auVar15._8_2_ = auVar116._4_2_;
              auVar15._0_8_ = auVar116._0_8_;
              auVar15._10_4_ = auVar11._10_4_;
              auVar25._6_8_ = 0;
              auVar25._0_6_ = auVar15._8_6_;
              auVar19._4_2_ = auVar116._2_2_;
              auVar19._0_4_ = auVar116._0_4_;
              auVar19._6_8_ = SUB148(auVar25 << 0x40,6);
              auVar114._0_4_ = auVar116._0_4_ & 0xffff;
              auVar114._4_10_ = auVar19._4_10_;
              auVar114._14_2_ = 0;
              auVar88 = pmaddwd(auVar114,auVar105);
              auVar116 = psraw(auVar112,8);
              auVar12._10_2_ = 0;
              auVar12._0_10_ = auVar116._0_10_;
              auVar12._12_2_ = auVar116._6_2_;
              auVar16._8_2_ = auVar116._4_2_;
              auVar16._0_8_ = auVar116._0_8_;
              auVar16._10_4_ = auVar12._10_4_;
              auVar26._6_8_ = 0;
              auVar26._0_6_ = auVar16._8_6_;
              auVar20._4_2_ = auVar116._2_2_;
              auVar20._0_4_ = auVar116._0_4_;
              auVar20._6_8_ = SUB148(auVar26 << 0x40,6);
              auVar113._0_4_ = auVar116._0_4_ & 0xffff;
              auVar113._4_10_ = auVar20._4_10_;
              auVar113._14_2_ = 0;
              auVar116 = pmaddwd(auVar113,auVar111);
              local_1b8._0_4_ = local_1b8._0_4_ + auVar116._0_4_ + auVar88._0_4_;
              local_1b8._4_4_ = local_1b8._4_4_ + auVar116._4_4_ + auVar88._4_4_;
              local_1b8._8_4_ = local_1b8._8_4_ + auVar116._8_4_ + auVar88._8_4_;
              local_1b8._12_4_ = local_1b8._12_4_ + auVar116._12_4_ + auVar88._12_4_;
              pcVar31 = pcVar31 + 2;
              puVar50 = puVar50 + 1;
              iVar43 = iVar43 + 2;
            } while (iVar43 < (int)_w);
            uVar29 = _w & 0xfffffffe;
          }
          if ((int)uVar29 < (int)_w) {
            do {
              cVar5 = *pcVar31;
              lVar41 = 0;
              do {
                *(int *)(local_1b8 + lVar41 * 4) =
                     *(int *)(local_1b8 + lVar41 * 4) +
                     (int)*(char *)((long)puVar50 + lVar41) * (int)cVar5;
                lVar41 = lVar41 + 1;
              } while (lVar41 != 4);
              pcVar31 = pcVar31 + 1;
              puVar50 = (ulong *)((long)puVar50 + 4);
              uVar29 = uVar29 + 1;
            } while (uVar29 != _w);
          }
          *pfVar28 = (float)(int)local_1b8._0_4_ * fVar109 + fVar85;
          pfVar28[1] = (float)(int)local_1b8._4_4_ * fVar109 + fVar85;
          pfVar28[2] = (float)(int)local_1b8._8_4_ * fVar109 + fVar85;
          pfVar28[3] = (float)(int)local_1b8._12_4_ * fVar109 + fVar85;
          pfVar28 = pfVar28 + 4;
          uVar35 = uVar40 + 4;
          uVar39 = uVar40 + 7;
          uVar40 = uVar35;
        } while (uVar39 < _h);
      }
      if ((int)uVar35 < (int)_h) {
        uVar29 = uVar49 + 3;
        if (-1 < (int)uVar49) {
          uVar29 = uVar49;
        }
        do {
          if ((int)_w < 1) {
            fVar104 = 0.0;
          }
          else {
            lVar41 = 0;
            iVar43 = 0;
            do {
              iVar43 = iVar43 + (int)*(char *)(local_118._0_8_ +
                                              lVar41 + (ulong)(((uint)uVar35 & 3) +
                                                              ((uint)(uVar35 >> 2) & 0x3fffffff)) *
                                                       local_d8 * local_118._16_8_) *
                                (int)*(char *)(local_c8._0_8_ +
                                              lVar41 + (long)(int)(((int)uVar29 >> 2) +
                                                                  (uVar49 - (uVar29 & 0xfffffffc)))
                                                       * local_88 * local_c8._16_8_);
              lVar41 = lVar41 + 1;
            } while (_w != (uint)lVar41);
            fVar104 = (float)iVar43;
          }
          *pfVar28 = fVar104 * fVar109 + fVar85;
          pfVar28 = pfVar28 + 1;
          uVar42 = (uint)uVar35 + 1;
          uVar35 = (ulong)uVar42;
        } while (uVar42 != _h);
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 < (long)local_1a0);
  }
  piVar21 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_c8._0_8_ != (void *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  piVar21 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
        if ((void *)local_118._0_8_ != (void *)0x0) {
          free((void *)local_118._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_118._32_8_)[3])();
      }
    }
  }
  piVar21 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar21 != (int *)0x0) {
    LOCK();
    *piVar21 = *piVar21 + -1;
    UNLOCK();
    if (*piVar21 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel,
        const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat& _bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h * kernel_w * inch, outw * outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                for (int p = 0; p < inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh;                // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i + 1);
            const signed char* img2 = bottom_im2row.row<signed char>(i + 2);
            const signed char* img3 = bottom_im2row.row<signed char>(i + 3);

            signed char* tmpptr = bottom_tm.channel(i / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4 * kernel_size, inch, outch / 4 + outch % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;
            const signed char* k1 = kernel + (p + 1) * inch * kernel_size;
            const signed char* k2 = kernel + (p + 2) * inch * kernel_size;
            const signed char* k3 = kernel + (p + 3) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q += 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4 + p % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i + 1] : 0.f;
            const float bias2 = bias ? bias[i + 2] : 0.f;
            const float bias3 = bias ? bias[i + 3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i + 1];
            const float scale_dequant2 = scale_dequant[i + 2];
            const float scale_dequant3 = scale_dequant[i + 3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i + 1);
            float* output2 = top_blob.channel(i + 2);
            float* output3 = top_blob.channel(i + 3);

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4);

                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2 * n]; // k0
                        sum0[n] += (int)va[1] * vb[2 * n + 1];

                        sum1[n] += (int)va[2] * vb[2 * n]; // k1
                        sum1[n] += (int)va[3] * vb[2 * n + 1];

                        sum2[n] += (int)va[4] * vb[2 * n]; // k2
                        sum2[n] += (int)va[5] * vb[2 * n + 1];

                        sum3[n] += (int)va[6] * vb[2 * n]; // k3
                        sum3[n] += (int)va[7] * vb[2 * n + 1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4);

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k < K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);
                int sum[4] = {0};

                int k = 0;
                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2 * n];
                        sum[n] += (int)va[1] * vb[2 * n + 1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j < N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);

                for (int k = 0; k < K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}